

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O2

void __thiscall embree::SubdivMesh::SubdivMesh(SubdivMesh *this,Device *device)

{
  size_t *psVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  size_t *psVar4;
  Topology *pTVar5;
  Device *pDVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  undefined8 uVar10;
  HoleSet *pHVar11;
  VertexCreaseMap *pVVar12;
  EdgeCreaseMap *pEVar13;
  BufferView<embree::Vec3fa> *pBVar14;
  ulong uVar15;
  Topology *pTVar16;
  long lVar17;
  size_t sVar18;
  size_t i_2;
  ulong uVar19;
  MemoryMonitorInterface *pMVar20;
  RawBufferView *this_00;
  size_t i;
  ulong uVar21;
  size_t i_3;
  size_type sVar22;
  Topology local_d0;
  
  Geometry::Geometry(&this->super_Geometry,device,GTY_SUBDIV_MESH,0,1);
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__SubdivMesh_021e0b20;
  *(undefined8 *)&(this->super_Geometry).field_0x58 = 0;
  (this->faceVertices).super_RawBufferView.ptr_ofs = (char *)0x0;
  (this->faceVertices).super_RawBufferView.dptr_ofs = (char *)0x0;
  (this->faceVertices).super_RawBufferView.stride = 0;
  *(undefined8 *)((long)&(this->faceVertices).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->faceVertices).super_RawBufferView.num + 4) = 0;
  (this->faceVertices).super_RawBufferView.modCounter = 1;
  (this->faceVertices).super_RawBufferView.modified = true;
  (this->faceVertices).super_RawBufferView.userData = 0;
  (this->faceVertices).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  (this->topology).size_active = 0;
  (this->topology).size_alloced = 0;
  (this->topology).items = (Topology *)0x0;
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  (this->vertices).items = (BufferView<embree::Vec3fa> *)0x0;
  (this->vertexAttribs).size_active = 0;
  (this->vertexAttribs).size_alloced = 0;
  (this->vertexAttribs).items = (RawBufferView *)0x0;
  (this->edge_creases).super_RawBufferView.ptr_ofs = (char *)0x0;
  (this->edge_creases).super_RawBufferView.dptr_ofs = (char *)0x0;
  (this->edge_creases).super_RawBufferView.stride = 0;
  *(undefined8 *)((long)&(this->edge_creases).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->edge_creases).super_RawBufferView.num + 4) = 0;
  (this->edge_creases).super_RawBufferView.modCounter = 1;
  (this->edge_creases).super_RawBufferView.modified = true;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.num + 4) = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)&(this->edge_creases).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->edge_creases).super_RawBufferView.buffer.ptr + 4) = 0;
  (this->edge_crease_weights).super_RawBufferView.modCounter = 1;
  (this->edge_crease_weights).super_RawBufferView.modified = true;
  *(undefined8 *)&(this->edge_crease_weights).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->edge_crease_weights).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.num + 4) = 0;
  (this->vertex_creases).super_RawBufferView.modCounter = 1;
  (this->vertex_creases).super_RawBufferView.modified = true;
  *(undefined8 *)&(this->vertex_creases).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->vertex_creases).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.num + 4) = 0;
  (this->vertex_crease_weights).super_RawBufferView.modCounter = 1;
  (this->vertex_crease_weights).super_RawBufferView.modified = true;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.num + 4) = 0;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->levels).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)&(this->vertex_crease_weights).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->vertex_crease_weights).super_RawBufferView.buffer.ptr + 4) = 0;
  (this->levels).super_RawBufferView.modCounter = 1;
  (this->levels).super_RawBufferView.modified = true;
  (this->levels).super_RawBufferView.userData = 0;
  (this->levels).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  psVar1 = &(this->topology).size_active;
  this->tessellationRate = 2.0;
  (this->holes).super_RawBufferView.ptr_ofs = (char *)0x0;
  (this->holes).super_RawBufferView.dptr_ofs = (char *)0x0;
  (this->holes).super_RawBufferView.stride = 0;
  (this->holes).super_RawBufferView.num = 0;
  (this->holes).super_RawBufferView.format = RTC_FORMAT_UNDEFINED;
  (this->holes).super_RawBufferView.modCounter = 1;
  (this->holes).super_RawBufferView.modified = true;
  pMVar20 = &device->super_MemoryMonitorInterface;
  if (device == (Device *)0x0) {
    pMVar20 = (MemoryMonitorInterface *)0x0;
  }
  *(undefined8 *)&(this->holes).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->holes).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined4 *)((long)&this->numHalfEdges + 4) = 0;
  (this->faceStartEdge).alloc.device = pMVar20;
  (this->faceStartEdge).alloc.hugepages = false;
  (this->faceStartEdge).items = (uint *)0x0;
  psVar2 = &(this->vertices).size_active;
  (this->faceStartEdge).size_active = 0;
  (this->faceStartEdge).size_alloced = 0;
  (this->halfEdgeFace).alloc.device = pMVar20;
  (this->halfEdgeFace).alloc.hugepages = false;
  (this->halfEdgeFace).size_active = 0;
  (this->halfEdgeFace).size_alloced = 0;
  (this->halfEdgeFace).items = (uint *)0x0;
  pHVar11 = (HoleSet *)::operator_new(0x18);
  *(pointer *)((long)&(pHVar11->holeSet).vec + 0x10) = (pointer)0x0;
  *(undefined8 *)&(pHVar11->holeSet).vec = 0;
  *(pointer *)((long)&(pHVar11->holeSet).vec + 8) = (pointer)0x0;
  (this->holeSet)._M_t.super___uniq_ptr_impl<embree::HoleSet,_std::default_delete<embree::HoleSet>_>
  ._M_t.super__Tuple_impl<0UL,_embree::HoleSet_*,_std::default_delete<embree::HoleSet>_>.
  super__Head_base<0UL,_embree::HoleSet_*,_false>._M_head_impl = pHVar11;
  (this->invalid_face).alloc.device = pMVar20;
  (this->invalid_face).alloc.hugepages = false;
  (this->invalid_face).size_active = 0;
  (this->invalid_face).size_alloced = 0;
  (this->invalid_face).items = (char *)0x0;
  (this->vertex_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertex_attrib_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_attrib_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_attrib_buffer_tags).
  super__Vector_base<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->patch_eval_trees).
  super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->patch_eval_trees).
  super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->patch_eval_trees).
  super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar12 = (VertexCreaseMap *)::operator_new(0x18);
  *(undefined8 *)&(pVVar12->vertexCreaseMap).vec = 0;
  *(pointer *)((long)&(pVVar12->vertexCreaseMap).vec + 8) = (pointer)0x0;
  *(pointer *)((long)&(pVVar12->vertexCreaseMap).vec + 0x10) = (pointer)0x0;
  (this->vertexCreaseMap)._M_t.
  super___uniq_ptr_impl<embree::VertexCreaseMap,_std::default_delete<embree::VertexCreaseMap>_>._M_t
  .super__Tuple_impl<0UL,_embree::VertexCreaseMap_*,_std::default_delete<embree::VertexCreaseMap>_>.
  super__Head_base<0UL,_embree::VertexCreaseMap_*,_false>._M_head_impl = pVVar12;
  pEVar13 = (EdgeCreaseMap *)::operator_new(0x18);
  *(undefined8 *)&(pEVar13->edgeCreaseMap).vec = 0;
  *(pointer *)((long)&(pEVar13->edgeCreaseMap).vec + 8) = (pointer)0x0;
  *(pointer *)((long)&(pEVar13->edgeCreaseMap).vec + 0x10) = (pointer)0x0;
  (this->edgeCreaseMap)._M_t.
  super___uniq_ptr_impl<embree::EdgeCreaseMap,_std::default_delete<embree::EdgeCreaseMap>_>._M_t.
  super__Tuple_impl<0UL,_embree::EdgeCreaseMap_*,_std::default_delete<embree::EdgeCreaseMap>_>.
  super__Head_base<0UL,_embree::EdgeCreaseMap_*,_false>._M_head_impl = pEVar13;
  this->commitCounter = 0;
  uVar19 = (ulong)(this->super_Geometry).numTimeSteps;
  if (uVar19 == 0) {
    *psVar2 = 0;
    sVar22 = 0;
  }
  else {
    pBVar14 = __gnu_cxx::new_allocator<embree::BufferView<embree::Vec3fa>_>::allocate
                        ((new_allocator<embree::BufferView<embree::Vec3fa>_> *)&this->vertices,
                         uVar19,(void *)0x0);
    (this->vertices).items = pBVar14;
    this_00 = (RawBufferView *)0x0;
    for (uVar21 = 0; uVar15 = *psVar2, uVar21 < uVar15; uVar21 = uVar21 + 1) {
      pBVar14 = (this->vertices).items;
      pcVar7 = this_00->ptr_ofs;
      pcVar8 = this_00->dptr_ofs;
      sVar18 = this_00->stride;
      sVar9 = this_00->num;
      uVar10 = *(undefined8 *)&this_00->modified;
      puVar3 = (undefined8 *)((long)&(pBVar14->super_RawBufferView).format + (long)this_00);
      *puVar3 = *(undefined8 *)&this_00->format;
      puVar3[1] = uVar10;
      psVar4 = (size_t *)((long)&(pBVar14->super_RawBufferView).stride + (long)this_00);
      *psVar4 = sVar18;
      psVar4[1] = sVar9;
      puVar3 = (undefined8 *)((long)&this_00->ptr_ofs + (long)&pBVar14->super_RawBufferView);
      *puVar3 = pcVar7;
      puVar3[1] = pcVar8;
      *(Buffer **)((long)&this_00->ptr_ofs + (long)&(pBVar14->super_RawBufferView).buffer.ptr) =
           (this_00->buffer).ptr;
      (this_00->buffer).ptr = (Buffer *)0x0;
      RawBufferView::~RawBufferView(this_00);
      this_00 = this_00 + 1;
    }
    lVar17 = uVar15 * 0x38 + 0x30;
    for (; uVar15 < uVar19; uVar15 = uVar15 + 1) {
      pBVar14 = (this->vertices).items;
      puVar3 = (undefined8 *)((long)pBVar14 + lVar17 + -0x20);
      *puVar3 = 0;
      puVar3[1] = 0;
      puVar3 = (undefined8 *)((long)pBVar14 + lVar17 + -0x30);
      *puVar3 = 0;
      puVar3[1] = 0;
      *(undefined8 *)((long)pBVar14 + lVar17 + -0x10) = 0x100000000;
      *(undefined1 *)((long)pBVar14 + lVar17 + -8) = 1;
      *(undefined4 *)((long)pBVar14 + lVar17 + -4) = 0;
      *(undefined8 *)((long)&(pBVar14->super_RawBufferView).ptr_ofs + lVar17) = 0;
      lVar17 = lVar17 + 0x38;
    }
    ::operator_delete((void *)0x0);
    (this->vertices).size_active = uVar19;
    (this->vertices).size_alloced = uVar19;
    sVar22 = (size_type)(this->super_Geometry).numTimeSteps;
  }
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::resize(&this->vertex_buffer_tags,sVar22);
  uVar19 = (this->topology).size_active;
  sVar18 = (this->topology).size_alloced;
  sVar22 = sVar18 + (sVar18 == 0);
  if (1 < uVar19) {
    lVar17 = 0xa0;
    for (uVar21 = 1; uVar21 < uVar19; uVar21 = uVar21 + 1) {
      Topology::~Topology((Topology *)((long)&((this->topology).items)->mesh + lVar17));
      uVar19 = (this->topology).size_active;
      lVar17 = lVar17 + 0xa0;
    }
    (this->topology).size_active = 1;
    sVar18 = (this->topology).size_alloced;
    uVar19 = 1;
  }
  if (sVar18 == sVar22) {
    if (uVar19 == 0) {
      Topology::Topology((this->topology).items);
    }
    *psVar1 = 1;
  }
  else {
    pTVar5 = (this->topology).items;
    pTVar16 = __gnu_cxx::new_allocator<embree::SubdivMesh::Topology>::allocate
                        ((new_allocator<embree::SubdivMesh::Topology> *)&this->topology,sVar22,
                         (void *)0x0);
    (this->topology).items = pTVar16;
    lVar17 = 0;
    for (uVar19 = 0; uVar21 = *psVar1, uVar19 < uVar21; uVar19 = uVar19 + 1) {
      pTVar16 = (Topology *)((long)&pTVar5->mesh + lVar17);
      Topology::Topology((Topology *)((long)&((this->topology).items)->mesh + lVar17),pTVar16);
      Topology::~Topology(pTVar16);
      lVar17 = lVar17 + 0xa0;
    }
    if (uVar21 == 0) {
      Topology::Topology((this->topology).items);
    }
    ::operator_delete(pTVar5);
    (this->topology).size_active = 1;
    (this->topology).size_alloced = sVar22;
  }
  local_d0.vertexIndices.super_RawBufferView.ptr_ofs = (char *)0x0;
  local_d0.vertexIndices.super_RawBufferView.dptr_ofs = (char *)0x0;
  local_d0.vertexIndices.super_RawBufferView.stride = 0;
  local_d0.vertexIndices.super_RawBufferView.num = 0;
  local_d0.vertexIndices.super_RawBufferView.format = RTC_FORMAT_UNDEFINED;
  local_d0.vertexIndices.super_RawBufferView.modCounter = 1;
  local_d0.vertexIndices.super_RawBufferView.modified = true;
  local_d0.vertexIndices.super_RawBufferView.userData = 0;
  local_d0.vertexIndices.super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  local_d0.subdiv_mode = RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY;
  pDVar6 = (this->super_Geometry).device;
  local_d0.halfEdges.alloc.device = &pDVar6->super_MemoryMonitorInterface;
  if (pDVar6 == (Device *)0x0) {
    local_d0.halfEdges.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_d0.halfEdges.alloc.hugepages = false;
  local_d0.halfEdges.size_active = 0;
  local_d0.halfEdges.size_alloced = 0;
  local_d0.halfEdges.items = (HalfEdge *)0x0;
  local_d0.halfEdges0.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.halfEdges0.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.halfEdges0.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.halfEdges1.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.halfEdges1.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.halfEdges1.
  super__Vector_base<embree::SubdivMesh::KeyHalfEdge,_std::allocator<embree::SubdivMesh::KeyHalfEdge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.mesh = this;
  Topology::operator=((this->topology).items,&local_d0);
  Topology::~Topology(&local_d0);
  return;
}

Assistant:

SubdivMesh::SubdivMesh (Device* device)
    : Geometry(device,GTY_SUBDIV_MESH,0,1), 
      displFunc(nullptr),
      tessellationRate(2.0f),
      numHalfEdges(0),
      faceStartEdge(device,0),
      halfEdgeFace(device,0),
      holeSet(new HoleSet),
      invalid_face(device,0),
      vertexCreaseMap(new VertexCreaseMap),
      edgeCreaseMap(new EdgeCreaseMap),
      commitCounter(0)
  {
    
    vertices.resize(numTimeSteps);
    vertex_buffer_tags.resize(numTimeSteps);
    topology.resize(1);
    topology[0] = Topology(this);
  }